

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::testHorizForcedBreaking(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AutoTableElement *pAVar5;
  QList<QRect> *pQVar6;
  QRect local_158;
  QRect local_148;
  QList<QRect> local_138;
  QList<QRect> local_120;
  double local_108;
  double local_100;
  undefined4 local_f4;
  QLatin1String local_f0;
  QString local_e0;
  QFont local_c8 [16];
  AutoTableElement local_b8 [32];
  Report local_98 [8];
  Report report;
  QLatin1Char local_7f;
  QChar local_7e [7];
  QString local_70;
  QString local_58;
  QString local_40;
  QByteArray local_28;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  if (fontFound) {
    fillModel(this,2,10,false);
    KDReports::Report::Report(local_98,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)local_98);
    pAVar5 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::AutoTableElement::AutoTableElement(local_b8,(QAbstractItemModel *)&this->m_model);
    KDReports::MainTable::setAutoTableElement(pAVar5);
    KDReports::AutoTableElement::~AutoTableElement(local_b8);
    KDReports::Report::scaleTo((int)local_98,2);
    QLatin1String::QLatin1String(&local_f0,"Noto Sans");
    QString::QString(&local_e0,local_f0);
    QFont::QFont(local_c8,&local_e0,0x18,-1,false);
    KDReports::Report::setDefaultFont((QFont *)local_98);
    QFont::~QFont(local_c8);
    QString::~QString(&local_e0);
    iVar3 = KDReports::Report::numberOfPages();
    bVar1 = QTest::qCompare(iVar3,2,"report.numberOfPages()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0x112);
    if ((bVar1 & 1) == 0) {
      local_f4 = 1;
    }
    else {
      KDReports::Report::mainTable();
      local_100 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
      local_108 = 1.0;
      bVar1 = QTest::qCompare(&local_100,&local_108,
                              "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0x113);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_138.d.d = (Data *)0x0;
        local_138.d.ptr = (QRect *)0x0;
        local_138.d.size = 0;
        QList<QRect>::QList(&local_138);
        QRect::QRect(&local_148,0,0,1,10);
        pQVar6 = QList<QRect>::operator<<(&local_138,&local_148);
        QRect::QRect(&local_158,1,0,1,10);
        pQVar6 = QList<QRect>::operator<<(pQVar6,&local_158);
        bVar2 = QTest::qCompare<QRect>
                          (&local_120,pQVar6,"report.mainTable()->pageRects()",
                           "QList<QRect>() << QRect(0, 0, 1, 10) << QRect(1, 0, 1, 10)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x115);
        QList<QRect>::~QList(&local_138);
        QList<QRect>::~QList(&local_120);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_f4 = 0;
        }
        else {
          local_f4 = 1;
        }
      }
      else {
        local_f4 = 1;
      }
    }
    KDReports::Report::~Report(local_98);
  }
  else {
    QString::QString(&local_58,"Font %1 not found");
    QString::QString(&local_70,"Noto Sans");
    QLatin1Char::QLatin1Char(&local_7f,' ');
    QChar::QChar(local_7e,local_7f);
    QString::arg(&local_40,(int)&local_58,(QChar *)&local_70);
    QString::toLatin1(&local_28,&local_40);
    pcVar4 = QByteArray::operator_cast_to_char_(&local_28);
    QTest::qSkip(pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x109);
    QByteArray::~QByteArray(&local_28);
    QString::~QString(&local_40);
    QString::~QString(&local_70);
    QString::~QString(&local_58);
  }
  return;
}

Assistant:

void testHorizForcedBreaking()
    {
        SKIP_IF_FONT_NOT_FOUND

        // There would be room for a single page horizontally, but the user forced 2
        fillModel(2, 10);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(2, 1);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 24));
        QCOMPARE(report.numberOfPages(), 2);
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, 1, 10) << QRect(1, 0, 1, 10));
    }